

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

void __thiscall
xercesc_4_0::CMStateSet::CMStateSet(CMStateSet *this,XMLSize_t bitCount,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  XMLSize_t XVar4;
  CMDynamicBuffer *pCVar2;
  
  this->fBitCount = bitCount;
  this->fDynamicBuffer = (CMDynamicBuffer *)0x0;
  if (bitCount < 0x81) {
    this->fBits[0] = 0;
    this->fBits[1] = 0;
    this->fBits[2] = 0;
    this->fBits[3] = 0;
  }
  else {
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,0x18);
    pCVar2 = (CMDynamicBuffer *)CONCAT44(extraout_var,iVar1);
    this->fDynamicBuffer = pCVar2;
    pCVar2->fMemoryManager = manager;
    XVar4 = ((this->fBitCount >> 10) + 1) - (ulong)((this->fBitCount & 0x3ff) == 0);
    pCVar2->fArraySize = XVar4;
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,XVar4 * 8);
    pCVar2 = this->fDynamicBuffer;
    pCVar2->fBitArray = (XMLInt32 **)CONCAT44(extraout_var_00,iVar1);
    if (pCVar2->fArraySize != 0) {
      uVar3 = 0;
      do {
        pCVar2->fBitArray[uVar3] = (XMLInt32 *)0x0;
        uVar3 = uVar3 + 1;
        pCVar2 = this->fDynamicBuffer;
      } while (uVar3 < pCVar2->fArraySize);
    }
  }
  return;
}

Assistant:

CMStateSet( const XMLSize_t bitCount
              , MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager) :

        fBitCount(bitCount)
        , fDynamicBuffer(0)
    {
        //
        //  See if we need to allocate the byte array or whether we can live
        //  within the cached bit high performance scheme.
        //
        if (fBitCount > (CMSTATE_CACHED_INT32_SIZE * 32))
        {
            fDynamicBuffer = (CMDynamicBuffer*)manager->allocate(sizeof(CMDynamicBuffer));
            fDynamicBuffer->fMemoryManager = manager;
            // allocate an array of vectors, each one containing CMSTATE_BITFIELD_CHUNK bits
            fDynamicBuffer->fArraySize = fBitCount / CMSTATE_BITFIELD_CHUNK;
            if (fBitCount % CMSTATE_BITFIELD_CHUNK)
                fDynamicBuffer->fArraySize++;
            try
            {
                fDynamicBuffer->fBitArray = (XMLInt32**) fDynamicBuffer->fMemoryManager->allocate(fDynamicBuffer->fArraySize*sizeof(XMLInt32*));
            }
            catch( const OutOfMemoryException& )
            {
                fDynamicBuffer->fMemoryManager->deallocate(fDynamicBuffer);
                throw;
            }
            for(XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
                fDynamicBuffer->fBitArray[index]=NULL;
        }
        else
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                fBits[index] = 0;
        }
    }